

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

int vocgobj(voccxdef *ctx,char **cmd,int *typelist,int cur,int *next,int complain,vocoldef *nounlist
           ,int multi,int chkact,int *no_match)

{
  runsdef *prVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  undefined8 *puVar5;
  undefined4 *puVar6;
  byte bVar7;
  char cVar8;
  uchar *puVar9;
  runsdef *prVar10;
  ushort *puVar11;
  vocoldef *nounlist_00;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  uint16_t tmp_1;
  undefined2 uVar19;
  uint uVar20;
  int iVar21;
  undefined4 uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uchar *puVar26;
  size_t sVar27;
  ushort **ppuVar28;
  undefined4 extraout_var;
  long lVar29;
  objnum oVar30;
  ulong uVar31;
  runcxdef *prVar32;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar33;
  undefined8 extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  uint *extraout_RDX_07;
  uint *extraout_RDX_08;
  uint *extraout_RDX_09;
  char *pcVar34;
  ulong uVar35;
  objnum oVar36;
  uint uVar37;
  uint uVar38;
  runcxdef *prVar39;
  uint *puVar40;
  uint uVar41;
  uint *list;
  uint *puVar42;
  long lVar43;
  byte *wrd;
  uint *puVar44;
  uint uVar45;
  uint uVar46;
  bool bVar47;
  ulong local_128;
  long local_120;
  uint local_ec;
  voccxdef *local_e8;
  runcxdef *local_e0;
  uint *local_d8;
  ulong local_d0;
  uint local_c8;
  int local_c4;
  uint local_c0;
  int local_bc;
  ulong local_b8;
  ushort *local_b0;
  uint *local_a8;
  uint *local_a0;
  uint local_98;
  uint local_94;
  uint *local_90;
  uint *local_88;
  int local_7c;
  uint local_78;
  int local_74;
  uchar *local_70;
  long local_68;
  uchar *local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  runsdef val;
  
  puVar9 = ctx->voc_stk_cur;
  puVar40 = (uint *)ctx->voc_stk_end;
  list = (uint *)(puVar9 + 8000);
  local_c4 = complain;
  if (list <= puVar40) {
    ctx->voc_stk_cur = (uchar *)list;
    puVar42 = (uint *)(puVar9 + 0x20d0);
    if (puVar42 <= puVar40) {
      local_128 = (ulong)(uint)cur;
      bVar47 = chkact != 0;
      local_48 = ". Checking for actor\\n";
      if (!bVar47) {
        local_48 = ". Reading noun phrase\\n";
      }
      local_74 = (uint)bVar47 * 3 + 5;
      uVar35 = (ulong)(bVar47 || multi == 0);
      local_60 = puVar9 + 0x48;
      local_70 = puVar9 + 0x20;
      uVar33 = CONCAT71((int7)((ulong)local_48 >> 8),1);
      uVar45 = 0;
      local_d8 = (uint *)next;
      local_58 = uVar35;
      do {
        ctx->voc_stk_cur = (uchar *)puVar42;
        puVar2 = list + 300;
        if (puVar40 < puVar2) break;
        ctx->voc_stk_cur = (uchar *)puVar2;
        puVar3 = list + 400;
        if (puVar40 < puVar3) break;
        ctx->voc_stk_cur = (uchar *)puVar3;
        puVar4 = list + 600;
        local_a0 = puVar2;
        local_90 = puVar3;
        if (puVar40 < puVar4) break;
        local_78 = (uint)uVar33;
        ctx->voc_stk_cur = (uchar *)puVar4;
        if (puVar40 < list + 0x278) break;
        ctx->voc_stk_cur = (uchar *)(list + 0x278);
        if (no_match != (int *)0x0) {
          *no_match = 0;
        }
        uVar38 = (uint)local_128;
        *local_d8 = uVar38;
        local_50 = uVar35;
        if ((uVar38 == 0xffffffff) || (local_120 = (long)(int)uVar38, cmd[local_120] == (char *)0x0)
           ) {
LAB_001f39a4:
          if ((local_78 & 1) == 0) {
            *local_d8 = (uint)local_50;
          }
          goto LAB_001f39c2;
        }
        local_a8 = puVar4;
        local_88 = puVar42;
        if ((ctx->voccxflg & 4) != 0) {
          outformat(local_48);
        }
        if (ctx->voccxpnp == 0xffff) {
LAB_001f28cf:
          prVar39 = (runcxdef *)0x0;
LAB_001f29d9:
          bVar7 = *cmd[local_120];
          local_e0 = prVar39;
          if ((bVar7 - 0x41 < 2) || (bVar7 == 0x59)) {
            lVar43 = (long)(int)uVar38;
            if (cmd[lVar43 + 1] == (char *)0x0) {
LAB_001f2ad4:
              uVar46 = 0;
            }
            else {
              if (chkact != 0) goto LAB_001f39a4;
              local_c8 = (uint)(bVar7 == 0x59);
              iVar21 = voc_check_special(ctx,cmd[lVar43 + 1],uVar38);
              local_e8 = (voccxdef *)CONCAT44(local_e8._4_4_,iVar21);
              uVar33 = extraout_RDX;
              if (iVar21 == 0) {
                iVar21 = uVar38 + 1;
                lVar43 = lVar43 + 1;
              }
              else {
                if ((ctx->voccxflg & 4) != 0) {
                  outformat("... found ALL/ANY/BOTH/EITHER OF\\n");
                  uVar33 = extraout_RDX_00;
                }
                if (cmd[lVar43 + 2] == (char *)0x0) {
                  if (*cmd[local_120] == 'A') {
                    iVar21 = 4;
                    pcVar34 = "I think you left something out after \"all of\".";
                  }
                  else if (*cmd[local_120] == 'Y') {
                    iVar21 = 0x1d;
                    pcVar34 = "I think you left something out after \"any of\".";
                  }
                  else {
                    iVar21 = 5;
                    pcVar34 = "There\'s something missing after \"both of\".";
                  }
LAB_001f3847:
                  vocerr(ctx,iVar21,pcVar34);
                  goto LAB_001f384e;
                }
                iVar21 = uVar38 + 2;
                lVar43 = lVar43 + 2;
              }
              local_d0 = CONCAT44(local_d0._4_4_,iVar21);
              iVar21 = (typelist[lVar43] & 1U) + iVar21;
              while( true ) {
                if (cmd[iVar21] == (char *)0x0) break;
                iVar25 = voc_check_special(ctx,cmd[iVar21],(int)uVar33);
                uVar33 = extraout_RDX_01;
                if (iVar25 == 0) {
                  if ((*(byte *)(typelist + iVar21) & 6) == 0) break;
LAB_001f2b42:
                  iVar21 = iVar21 + 1;
                }
                else {
                  if ((byte *)cmd[(long)iVar21 + 1] == (byte *)0x0) {
                    vocerr(ctx,6,"I expected a noun after \"of\".");
                    goto LAB_001f386e;
                  }
                  if ((*cmd[(long)iVar21 + 1] & 1U) == 0) goto LAB_001f2b42;
                  iVar21 = iVar21 + 2;
                }
              }
              uVar46 = local_c8;
              if (((int)uVar38 < iVar21) &&
                 ((bVar7 == 0x59 && (int)local_e8 == 0 ||
                  ((typelist[(long)iVar21 + -1] & 0x40U) != 0)))) {
                if ((ctx->voccxflg & 4) != 0) {
                  outformat("... found ALL/ANY/BOTH/EITHER + noun phrase\\n");
                }
                local_128 = local_d0 & 0xffffffff;
                local_120 = lVar43;
                uVar46 = local_c8;
              }
            }
            wrd = (byte *)cmd[local_120];
            bVar7 = *wrd;
            iVar21 = (int)local_128;
            if (((char)uVar46 == '\0') && (bVar7 == 0x41)) {
              if (chkact != 0) goto LAB_001f39a4;
              if ((ctx->voccxflg & 4) != 0) {
                outformat("... found ALL\\n");
              }
              lVar43 = (long)(int)local_e0;
              (puVar9 + lVar43 * 0x28)[0] = 0xff;
              (puVar9 + lVar43 * 0x28)[1] = 0xff;
              puVar26 = puVar9 + lVar43 * 0x28 + 0x20;
              puVar26[0] = '\x01';
              puVar26[1] = '\0';
              puVar26[2] = '\0';
              puVar26[3] = '\0';
              pcVar34 = cmd[local_120];
              *(char **)(puVar9 + lVar43 * 0x28 + 0x10) = pcVar34;
              *(char **)(puVar9 + lVar43 * 0x28 + 8) = pcVar34;
              uVar41 = (int)local_e0 + 1;
              uVar46 = iVar21 + 1;
              if ((cmd[(long)iVar21 + 1] != (char *)0x0) && (*cmd[(long)iVar21 + 1] == 'X')) {
                if ((ctx->voccxflg & 4) != 0) {
                  outformat("... found ALL EXCEPT\\n");
                }
                puVar44 = local_d8;
                nounlist_00 = (vocoldef *)ctx->voc_stk_cur;
                if ((vocoldef *)ctx->voc_stk_end < nounlist_00 + 200) break;
                ctx->voc_stk_cur = (uchar *)(nounlist_00 + 200);
                uVar38 = vocgobj(ctx,cmd,typelist,iVar21 + 2,(int *)local_d8,local_c4,nounlist_00,1,
                                 0,(int *)0x0);
                if ((int)uVar38 < 0) goto LAB_001f39e2;
                uVar46 = *puVar44;
                if (uVar38 != 0) {
                  uVar35 = (ulong)local_e0 & 0xffffffff;
                  uVar41 = (int)local_e0 + uVar38 + 1;
                  lVar43 = 0;
                  do {
                    uVar33 = *(undefined8 *)((long)&nounlist_00->vocolflg + lVar43);
                    *(undefined8 *)(local_60 + lVar43 + uVar35 * 0x28) = uVar33;
                    puVar5 = (undefined8 *)((long)&nounlist_00->vocolobj + lVar43);
                    uVar15 = *puVar5;
                    uVar16 = puVar5[1];
                    puVar5 = (undefined8 *)((long)&nounlist_00->vocollst + lVar43);
                    uVar17 = puVar5[1];
                    *(undefined8 *)(local_60 + lVar43 + uVar35 * 0x28 + -0x10) = *puVar5;
                    *(undefined8 *)(local_60 + lVar43 + uVar35 * 0x28 + -0x10 + 8) = uVar17;
                    *(undefined8 *)(local_60 + lVar43 + uVar35 * 0x28 + -0x20) = uVar15;
                    *(undefined8 *)(local_60 + lVar43 + uVar35 * 0x28 + -0x20 + 8) = uVar16;
                    local_60[lVar43 + uVar35 * 0x28] = (byte)uVar33 | 2;
                    lVar43 = lVar43 + 0x28;
                  } while ((ulong)uVar38 * 0x28 != lVar43);
                }
              }
              *local_d8 = uVar46;
              (puVar9 + (long)(int)uVar41 * 0x28)[0] = 0xff;
              (puVar9 + (long)(int)uVar41 * 0x28)[1] = 0xff;
              puVar26 = puVar9 + (long)(int)uVar41 * 0x28 + 0x20;
              puVar26[0] = '\0';
              puVar26[1] = '\0';
              puVar26[2] = '\0';
              puVar26[3] = '\0';
              prVar39 = (runcxdef *)(ulong)uVar41;
            }
            else {
              local_c8 = uVar46;
              if (bVar7 < 0x52) {
                if (bVar7 == 0x49) {
                  uVar22 = 4;
                }
                else {
                  if (bVar7 != 0x4d) {
LAB_001f2d8c:
                    uVar38 = typelist[local_120];
                    if (((uVar38 & 0x87) == 0) &&
                       (((char)bVar7 < '\0' ||
                        (ppuVar28 = __ctype_b_loc(),
                        (*(byte *)((long)*ppuVar28 + (ulong)bVar7 * 2 + 1) & 8) == 0))))
                    goto LAB_001f39a4;
                    if ((uVar38 & 1) != 0) {
                      local_128 = (ulong)(iVar21 + 1U);
                      wrd = (byte *)cmd[(long)iVar21 + 1];
                      if (wrd != (byte *)0x0) {
                        local_120 = (long)iVar21 + 1;
                        uVar38 = typelist[local_120];
                        if (((uVar38 & 0x86) != 0) ||
                           ((bVar7 = *wrd, -1 < (long)(char)bVar7 &&
                            (ppuVar28 = __ctype_b_loc(),
                            (*(byte *)((long)*ppuVar28 + (long)(char)bVar7 * 2 + 1) & 8) != 0))))
                        goto LAB_001f2e17;
                      }
                      vocerr(ctx,7,"An article must be followed by a noun.");
                      *local_d8 = iVar21 + 1U;
LAB_001f386e:
                      uVar38 = 0xffffffff;
                      goto LAB_001f39e2;
                    }
LAB_001f2e17:
                    iVar25 = 0;
                    local_d0 = 0xffffffff;
                    iVar21 = 0;
                    uVar35 = local_128;
LAB_001f2e2c:
                    iVar24 = (int)uVar35;
                    if ((uVar38 & 2) != 0) {
LAB_001f2ec6:
                      uVar31 = (ulong)(iVar24 + 1);
LAB_001f2ece:
                      uVar35 = uVar31;
                      wrd = (byte *)cmd[(int)uVar35];
                      if (wrd == (byte *)0x0) goto LAB_001f3166;
                      uVar38 = typelist[(int)uVar35];
                      if ((uVar38 & 0x40) != 0) {
                        iVar21 = 1;
                      }
                      goto LAB_001f2e2c;
                    }
                    if ((char)uVar38 < '\0') {
                      iVar25 = iVar25 + 1;
                      goto LAB_001f2ec6;
                    }
                    local_e8 = (voccxdef *)CONCAT44(local_e8._4_4_,iVar21);
                    if ((uVar38 & 4) == 0) {
                      bVar7 = *wrd;
                      if (((long)(char)bVar7 < 0) ||
                         (ppuVar28 = __ctype_b_loc(), iVar21 = extraout_EDX,
                         (*(byte *)((long)*ppuVar28 + (long)(char)bVar7 * 2 + 1) & 8) == 0)) {
                        iVar23 = voc_check_special(ctx,(char *)wrd,iVar21);
                        iVar21 = (int)local_e8;
                        if ((iVar23 == 0) || ((int)local_d0 != -1)) goto LAB_001f3166;
                        uVar31 = (ulong)((2 - (uint)((*(byte *)(typelist + (long)iVar24 + 1) & 1) ==
                                                    0)) + iVar24);
                        local_d0 = uVar35;
                      }
                      else {
                        uVar31 = (ulong)(iVar24 + 1);
                        iVar21 = (int)local_e8;
                      }
                      goto LAB_001f2ece;
                    }
                    uVar38 = iVar24 + 1;
                    pcVar34 = cmd[(long)iVar24 + 1];
                    if (pcVar34 != (char *)0x0) {
                      cVar8 = *pcVar34;
                      if ((long)cVar8 < 0) {
                        uVar35 = (ulong)uVar38;
                      }
                      else {
                        ppuVar28 = __ctype_b_loc();
                        uVar46 = iVar24 + 2;
                        if ((*(byte *)((long)*ppuVar28 + (long)cVar8 * 2 + 1) & 8) == 0) {
                          uVar46 = uVar38;
                        }
                        uVar35 = (ulong)uVar46;
                        pcVar34 = cmd[(int)uVar46];
                        iVar21 = extraout_EDX_00;
                        if (pcVar34 == (char *)0x0) {
                          iVar21 = (int)local_e8;
                          goto LAB_001f3166;
                        }
                      }
                      iVar24 = voc_check_special(ctx,pcVar34,iVar21);
                      uVar31 = uVar35;
                      iVar21 = (int)local_e8;
                      if (iVar24 == 0) goto LAB_001f3166;
                      goto LAB_001f2ece;
                    }
                    uVar35 = (ulong)uVar38;
LAB_001f3166:
                    local_e8 = (voccxdef *)CONCAT44(local_e8._4_4_,iVar21);
                    iVar21 = (int)local_128;
                    uVar38 = (uint)uVar35;
                    voc_make_obj_name(ctx,(char *)local_a8,cmd,iVar21,uVar38);
                    *local_d8 = uVar38;
                    if (iVar25 < 1) {
                      local_c0 = iVar21 + 1;
                      local_68 = (long)(int)local_c0;
                      local_94 = (uint)CONCAT71((int7)(int3)(local_c0 >> 8),1);
                      local_bc = 0;
                      local_98 = 0;
                      uVar31 = 0xffffffff;
                      while( true ) {
                        local_7c = (int)uVar31;
                        uVar38 = (uint)uVar35;
                        iVar25 = vocgol(ctx,(objnum *)list,local_88,cmd,typelist,iVar21,iVar21,
                                        uVar38,(int)local_d0);
                        local_b8 = CONCAT44(extraout_var,iVar25);
                        pcVar34 = cmd[local_120];
                        cVar8 = *pcVar34;
                        lVar43 = (long)cVar8;
                        if (lVar43 < 0) {
                          bVar47 = false;
                          puVar40 = extraout_RDX_02;
                        }
                        else {
                          ppuVar28 = __ctype_b_loc();
                          puVar40 = (uint *)((ulong)local_e8 & 0xffffffff);
                          if ((((((*ppuVar28)[lVar43] >> 0xb & 1) == 0) ||
                               (bVar47 = true, (int)local_e8 == 0)) &&
                              (bVar47 = false, ((*ppuVar28)[lVar43] >> 0xb & 1) != 0)) &&
                             (uVar38 != local_c0)) {
                            iVar25 = atoi(pcVar34);
                            bVar47 = iVar25 == 1;
                            puVar40 = extraout_RDX_03;
                          }
                        }
                        if ((int)local_b8 < 1) {
                          if (chkact != 0) goto LAB_001f39a4;
                          if ((cVar8 < '\0') ||
                             (ppuVar28 = __ctype_b_loc(),
                             (*(byte *)((long)*ppuVar28 + lVar43 * 2 + 1) & 8) == 0)) {
                            uVar38 = 0xffffffff;
                            if ((int)local_b8 != 0) goto LAB_001f39e2;
                            vocerr(ctx,9,"I don\'t see any %s here.",local_a8);
                            goto LAB_001f384e;
                          }
                          if (!bVar47) {
                            lVar43 = (long)(int)local_e0;
                            (puVar9 + lVar43 * 0x28)[0] = 0xff;
                            (puVar9 + lVar43 * 0x28)[1] = 0xff;
                            puVar26 = puVar9 + lVar43 * 0x28 + 0x20;
                            puVar26[0] = '\x10';
                            puVar26[1] = '\0';
                            puVar26[2] = '\0';
                            puVar26[3] = '\0';
                            pcVar34 = cmd[local_120];
                            *(char **)(puVar9 + lVar43 * 0x28 + 0x10) = pcVar34;
                            *(char **)(puVar9 + lVar43 * 0x28 + 8) = pcVar34;
                            *local_d8 = local_c0;
                            uVar38 = (int)local_e0 + 1;
                            (puVar9 + (long)(int)uVar38 * 0x28)[0] = 0xff;
                            (puVar9 + (long)(int)uVar38 * 0x28)[1] = 0xff;
                            puVar26 = puVar9 + (long)(int)uVar38 * 0x28 + 0x20;
                            puVar26[0] = '\0';
                            puVar26[1] = '\0';
                            puVar26[2] = '\0';
                            puVar26[3] = '\0';
                            goto LAB_001f2a66;
                          }
                          bVar47 = false;
                          local_bc = 1;
                          puVar40 = extraout_RDX_04;
                        }
                        if ((int)uVar38 <= (int)local_c0) break;
                        bVar47 = !bVar47;
                        lVar43 = local_68;
LAB_001f3361:
                        while ((iVar25 = voc_check_special(ctx,cmd[lVar43],(int)puVar40),
                               puVar40 = extraout_RDX_05, iVar25 != 0 ||
                               ((*(byte *)(typelist + lVar43) & 1) != 0))) {
LAB_001f348c:
                          lVar43 = lVar43 + 1;
                          if (uVar38 == (uint)lVar43) goto LAB_001f35c7;
                        }
                        uVar46 = vocgol(ctx,(objnum *)local_a0,local_90,cmd,typelist,iVar21,
                                        (int)lVar43,uVar38,(int)local_d0);
                        if ((int)uVar46 < 0) goto LAB_001f384e;
                        if ((int)local_b8 == 0) {
                          memcpy(list,local_a0,(ulong)(uVar46 * 2 + 2));
                          memcpy(local_88,local_90,(ulong)uVar46 << 2);
                          local_b8 = (ulong)uVar46;
                          puVar40 = extraout_RDX_07;
                        }
                        else {
                          oVar30 = (objnum)*list;
                          if (oVar30 == 0xffff) {
                            local_b8 = 0;
                            puVar40 = extraout_RDX_06;
                          }
                          else {
                            lVar29 = 0;
                            local_b8 = 0;
                            do {
                              oVar36 = (objnum)*local_a0;
                              puVar40 = local_a0;
                              if (oVar36 != 0xffff) {
                                puVar40 = (uint *)0x320;
                                do {
                                  if (oVar30 == oVar36) {
                                    iVar25 = (int)local_b8;
                                    *(objnum *)((long)list + (long)iVar25 * 2) = oVar30;
                                    local_88[iVar25] =
                                         *(uint *)((long)list + (long)puVar40 * 2) |
                                         local_88[lVar29];
                                    local_b8 = (ulong)(iVar25 + 1);
                                    puVar40 = local_88;
                                    break;
                                  }
                                  oVar36 = *(objnum *)((long)((long)list + 0x192) + (long)puVar40);
                                  puVar40 = (uint *)((long)puVar40 + 2);
                                } while (oVar36 != 0xffff);
                              }
                              oVar30 = *(objnum *)((long)list + lVar29 * 2 + 2);
                              lVar29 = lVar29 + 1;
                            } while (oVar30 != 0xffff);
                          }
                          *(objnum *)((long)list + (long)(int)local_b8 * 2) = 0xffff;
                        }
                        if ((int)local_b8 != 0) goto LAB_001f348c;
                        if ((ctx->voccxflg & 4) != 0) {
                          outformat("... can\'t find any objects matching these words\\n");
                          puVar40 = extraout_RDX_08;
                        }
                        puVar44 = local_d8;
                        if ((int)local_d0 != -1) {
                          pcVar34 = "... dropping the part after OF and retrying\\n";
                          if ((ctx->voccxflg & 4) == 0) goto LAB_001f3521;
                          goto LAB_001f351c;
                        }
                        if (!bVar47) {
                          local_bc = 1;
                          bVar47 = true;
                          local_d0 = 0xffffffff;
                          local_b8 = 0;
                          lVar43 = local_68;
                          if ((ctx->voccxflg & 4) != 0) {
                            outformat("... treating the number as a count and retrying\\n");
                            puVar40 = extraout_RDX_09;
                            lVar43 = local_68;
                          }
                          goto LAB_001f3361;
                        }
                        lVar43 = (long)(int)uVar38;
                        local_d0 = uVar35;
                        do {
                          lVar43 = lVar43 + -1;
                          if (lVar43 <= local_120) {
                            if (chkact == 0) {
                              if (local_c4 != 0) {
                                vocerr(ctx,9,"I don\'t see any %s here.",local_a8);
                              }
                              if (no_match != (int *)0x0) {
                                *no_match = 1;
                              }
                            }
                            goto LAB_001f39a4;
                          }
                          local_d0 = (ulong)((int)local_d0 - 1);
                        } while ((*(byte *)(typelist + lVar43) & 8) == 0);
                        pcVar34 = "... changing word to prep and retrying\\n";
                        if ((ctx->voccxflg & 4) != 0) {
LAB_001f351c:
                          outformat(pcVar34);
                        }
LAB_001f3521:
                        voc_make_obj_name(ctx,(char *)local_a8,cmd,iVar21,(int)local_d0);
                        uVar18 = local_d0;
                        *puVar44 = (uint)local_d0;
                        local_98 = 0x4000;
                        local_94 = 0;
                        local_d0 = 0xffffffff;
                        uVar31 = uVar35;
                        uVar35 = uVar18;
                      }
LAB_001f35c7:
                      uVar35 = local_b8;
                      if ((ctx->voccxflg & 4) != 0) {
                        outformat("... found objects matching vocabulary:\\n");
                      }
                      prVar39 = local_e0;
                      if (0 < (int)uVar35) {
                        puVar40 = (uint *)(long)(int)uVar38;
                        uVar41 = (uint)(local_bc != 0) << 5 | local_98;
                        lVar43 = (long)local_7c;
                        iVar21 = (int)local_e0;
                        local_e0 = (runcxdef *)((ulong)local_e0 & 0xffffffff);
                        puVar44 = (uint *)(local_70 + (long)local_e0 * 0x28);
                        uVar31 = 0;
                        local_90 = (uint *)CONCAT44(local_90._4_4_,uVar41);
                        uVar46 = local_c8;
                        local_e8 = ctx;
                        local_a0 = puVar40;
                        do {
                          if ((local_e8->voccxflg & 4) != 0) {
                            outformat("..... ");
                            oVar30 = *(objnum *)((long)list + uVar31 * 2);
                            runpprop(local_e8->voccxrun,(uchar **)0x0,0,0,oVar30,8,0,0,oVar30);
                            outflushn(1);
                            puVar40 = local_a0;
                            uVar46 = local_c8;
                            uVar41 = (uint)local_90;
                          }
                          ctx = local_e8;
                          *(char **)(puVar44 + -6) = cmd[local_120];
                          *(char **)(puVar44 + -4) = cmd[(long)puVar40 + -1];
                          uVar20 = local_88[uVar31];
                          *puVar44 = uVar20 | uVar41;
                          if ((local_94 & 1) == 0) {
                            *(char **)(puVar44 + -2) = cmd[lVar43 + -1];
                          }
                          if ((char)uVar46 != '\0') {
                            *puVar44 = uVar20 | uVar41 | 0x80;
                          }
                          *(objnum *)(puVar44 + -8) = *(objnum *)((long)list + uVar31 * 2);
                          if (200 - iVar21 == uVar31) {
                            vocerr(local_e8,10,"You\'re referring to too many objects with \"%s\".",
                                   local_a8);
                            uVar38 = 0xfffffffe;
                            goto LAB_001f39e2;
                          }
                          uVar31 = uVar31 + 1;
                          puVar44 = puVar44 + 10;
                        } while ((uVar35 & 0xffffffff) != uVar31);
                        prVar39 = (runcxdef *)(ulong)(uint)((int)local_e0 + (int)uVar31);
                      }
                      if (((local_c0 == uVar38) && (cVar8 = *cmd[local_120], -1 < (long)cVar8)) &&
                         (local_e0 = prVar39, ppuVar28 = __ctype_b_loc(), prVar39 = local_e0,
                         (*(byte *)((long)*ppuVar28 + (long)cVar8 * 2 + 1) & 8) != 0)) {
                        lVar43 = (long)(int)local_e0;
                        *(objnum *)(puVar9 + lVar43 * 0x28) = ctx->voccxnum;
                        puVar26 = puVar9 + lVar43 * 0x28 + 0x20;
                        puVar26[0] = '\x10';
                        puVar26[1] = '\0';
                        puVar26[2] = '\0';
                        puVar26[3] = '\0';
                        pcVar34 = cmd[local_120];
                        *(char **)(puVar9 + lVar43 * 0x28 + 0x10) = pcVar34;
                        *(char **)(puVar9 + lVar43 * 0x28 + 8) = pcVar34;
                        prVar39 = (runcxdef *)(ulong)((int)local_e0 + 1);
                      }
                      (puVar9 + (long)(int)prVar39 * 0x28)[0] = 0xff;
                      (puVar9 + (long)(int)prVar39 * 0x28)[1] = 0xff;
                      puVar26 = puVar9 + (long)(int)prVar39 * 0x28 + 0x20;
                      puVar26[0] = '\0';
                      puVar26[1] = '\0';
                      puVar26[2] = '\0';
                      puVar26[3] = '\0';
                    }
                    else {
                      puVar26 = local_70 + ((ulong)local_e0 & 0xffffffff) * 0x28;
                      lVar43 = ((ulong)local_e0 & 0xffffffff) << 0x20;
                      uVar46 = iVar25 + 1;
                      prVar39 = local_e0;
                      do {
                        lVar43 = lVar43 + 0x100000000;
                        puVar26[-0x20] = 0xff;
                        puVar26[-0x1f] = 0xff;
                        puVar26[0] = '\0';
                        puVar26[1] = '\b';
                        puVar26[2] = '\0';
                        puVar26[3] = '\0';
                        *(char **)(puVar26 + -0x18) = cmd[local_120];
                        *(char **)(puVar26 + -0x10) = cmd[(long)(int)uVar38 + -1];
                        puVar26 = puVar26 + 0x28;
                        prVar39 = (runcxdef *)(ulong)((int)prVar39 + 1);
                        uVar46 = uVar46 - 1;
                      } while (1 < uVar46);
                      (puVar9 + (lVar43 >> 0x20) * 0x28)[0] = 0xff;
                      (puVar9 + (lVar43 >> 0x20) * 0x28)[1] = 0xff;
                      puVar26 = puVar9 + (lVar43 >> 0x20) * 0x28 + 0x20;
                      puVar26[0] = '\0';
                      puVar26[1] = '\0';
                      puVar26[2] = '\0';
                      puVar26[3] = '\0';
                    }
                    goto LAB_001f3023;
                  }
                  uVar22 = 0x100;
                }
              }
              else if (bVar7 == 0x52) {
                uVar22 = 0x200;
              }
              else {
                if (bVar7 != 0x54) goto LAB_001f2d8c;
                uVar22 = 8;
              }
              iVar25 = (int)local_e0;
              lVar43 = (long)iVar25;
              *(undefined4 *)(puVar9 + lVar43 * 0x28 + 0x20) = uVar22;
              if ((ctx->voccxflg & 4) != 0) {
                outformat("... found pronoun\\n");
                iVar25 = (int)local_e0;
              }
              *local_d8 = iVar21 + 1;
              (puVar9 + lVar43 * 0x28)[0] = 0xff;
              (puVar9 + lVar43 * 0x28)[1] = 0xff;
              pcVar34 = cmd[local_120];
              *(char **)(puVar9 + lVar43 * 0x28 + 0x10) = pcVar34;
              *(char **)(puVar9 + lVar43 * 0x28 + 8) = pcVar34;
              prVar39 = (runcxdef *)(ulong)(iVar25 + 1);
            }
          }
          else {
            if (bVar7 != 0x22) goto LAB_001f2ad4;
            if (chkact != 0) goto LAB_001f39a4;
            if ((ctx->voccxflg & 4) != 0) {
              outformat("... found quoted string\\n");
            }
            lVar43 = (long)(int)local_e0;
            (puVar9 + lVar43 * 0x28)[0] = 0xff;
            (puVar9 + lVar43 * 0x28)[1] = 0xff;
            puVar26 = puVar9 + lVar43 * 0x28 + 0x20;
            puVar26[0] = '\0';
            puVar26[1] = '\x04';
            puVar26[2] = '\0';
            puVar26[3] = '\0';
            pcVar34 = cmd[local_120];
            *(char **)(puVar9 + lVar43 * 0x28 + 0x10) = pcVar34;
            *(char **)(puVar9 + lVar43 * 0x28 + 8) = pcVar34;
            *local_d8 = uVar38 + 1;
            uVar38 = (int)local_e0 + 1;
LAB_001f2a66:
            prVar39 = (runcxdef *)(ulong)uVar38;
          }
        }
        else {
          prVar39 = ctx->voccxrun;
          val.runstyp = (uchar)local_74;
          runpush(prVar39,local_74,&val);
          iVar21 = (uint)(local_c4 != 0) * 3 + 5;
          val.runstyp = (uchar)iVar21;
          runpush(prVar39,iVar21,&val);
          local_e0 = prVar39;
          runpnum(prVar39,(long)(int)(uVar38 + 1));
          pcVar34 = *cmd;
          if (pcVar34 == (char *)0x0) {
            voc_push_list_siz(ctx,0);
LAB_001f2716:
            uVar46 = 0;
            voc_push_list_siz(ctx,0);
          }
          else {
            uVar37 = 0;
            uVar35 = 0;
            do {
              if (*pcVar34 == '\0') {
                puVar26 = voc_push_list_siz(ctx,uVar37);
                if ((int)uVar35 == 0) goto LAB_001f2716;
                goto LAB_001f2680;
              }
              pcVar34 = cmd[uVar35 + 1];
              uVar35 = uVar35 + 1;
              uVar37 = uVar37 + 5;
            } while (pcVar34 != (char *)0x0);
            puVar26 = voc_push_list_siz(ctx,uVar37);
LAB_001f2680:
            uVar46 = (uint)uVar35;
            uVar31 = 0;
            do {
              *puVar26 = '\x01';
              *(int *)(puVar26 + 1) = typelist[uVar31];
              puVar26 = puVar26 + 5;
              uVar31 = uVar31 + 1;
            } while ((uVar35 & 0xffffffff) != uVar31);
            lVar43 = 0;
            uVar37 = 0;
            do {
              sVar27 = strlen(cmd[lVar43]);
              uVar37 = uVar37 + (int)sVar27 + 3;
              lVar43 = lVar43 + 1;
            } while (uVar46 != (uint)lVar43);
            local_e8 = ctx;
            puVar26 = voc_push_list_siz(ctx,uVar37);
            lVar43 = 0;
            do {
              *puVar26 = '\x03';
              sVar27 = strlen(cmd[lVar43]);
              *(short *)(puVar26 + 1) = (short)sVar27 + 2;
              memcpy(puVar26 + 3,cmd[lVar43],sVar27);
              puVar26 = puVar26 + sVar27 + 3;
              lVar43 = lVar43 + 1;
              ctx = local_e8;
            } while (uVar46 != (uint)lVar43);
          }
          prVar39 = local_e0;
          runfn(local_e0,ctx->voccxpnp,5);
          prVar10 = prVar39->runcxsp;
          prVar1 = prVar10 + -1;
          if (prVar10[-1].runstyp == '\a') {
            prVar39->runcxsp = prVar1;
            if (prVar1->runstyp != '\a') {
              prVar39->runcxerr->errcxptr->erraac = 0;
              runsign(prVar39,0x3fc);
            }
            puVar11 = (ushort *)prVar10[-1].runsv.runsvstr;
            local_ec = *puVar11 - 2;
            local_b0 = puVar11 + 1;
            iVar21 = 2;
            if (local_ec < 2) {
              prVar39 = (runcxdef *)0x0;
            }
            else {
              prVar39 = (runcxdef *)0x0;
              if ((char)*local_b0 == '\x01') {
                uVar20 = *(int *)((long)puVar11 + 3) - 1;
                *local_d8 = uVar20;
                uVar41 = uVar38;
                if (((int)uVar20 < (int)uVar38) || (uVar41 = uVar46, (int)uVar46 < (int)uVar20)) {
                  *local_d8 = uVar41;
                }
                lstadv((uchar **)&local_b0,&local_ec);
                if (local_ec == 0) {
                  puVar9[0] = 0xff;
                  puVar9[1] = 0xff;
                  puVar9[0x20] = '\0';
                  puVar9[0x21] = '\0';
                  puVar9[0x22] = '\0';
                  puVar9[0x23] = '\0';
                  if (no_match != (int *)0x0) {
LAB_001f294f:
                    uVar46 = (uint)((int)uVar38 < (int)*local_d8);
                    prVar39 = (runcxdef *)0x0;
                    goto LAB_001f2959;
                  }
                  prVar39 = (runcxdef *)0x0;
                }
                else {
                  puVar26 = puVar9;
                  uVar46 = 0;
                  do {
                    while ((char)*local_b0 == '\x05') {
                      uVar19 = 0xffff;
LAB_001f2845:
                      *(undefined2 *)puVar26 = uVar19;
                      lstadv((uchar **)&local_b0,&local_ec);
                      if ((local_ec == 0) || ((char)*local_b0 != '\x01')) {
                        puVar26[0x20] = '\0';
                        puVar26[0x21] = '\0';
                        puVar26[0x22] = '\0';
                        puVar26[0x23] = '\0';
                      }
                      else {
                        *(undefined4 *)(puVar26 + 0x20) = *(undefined4 *)((long)local_b0 + 1);
                        lstadv((uchar **)&local_b0,&local_ec);
                      }
                      *(char **)(puVar26 + 8) = cmd[local_120];
                      *(char **)(puVar26 + 0x10) = cmd[(long)(int)*local_d8 + -1];
                      puVar26 = puVar26 + 0x28;
                      prVar39 = (runcxdef *)(ulong)(uVar46 + 1);
                      if ((local_ec == 0) || (bVar47 = 0xc5 < uVar46, uVar46 = uVar46 + 1, bVar47))
                      goto LAB_001f28ee;
                    }
                    if ((char)*local_b0 == '\x02') {
                      uVar19 = *(undefined2 *)((long)local_b0 + 1);
                      goto LAB_001f2845;
                    }
                    lstadv((uchar **)&local_b0,&local_ec);
                  } while (local_ec != 0);
                  prVar39 = (runcxdef *)(ulong)uVar46;
LAB_001f28ee:
                  puVar26[0] = 0xff;
                  puVar26[1] = 0xff;
                  puVar26[0x20] = '\0';
                  puVar26[0x21] = '\0';
                  puVar26[0x22] = '\0';
                  puVar26[0x23] = '\0';
                  if (no_match != (int *)0x0) {
                    uVar46 = 0;
                    if ((int)prVar39 == 0) goto LAB_001f294f;
LAB_001f2959:
                    *no_match = uVar46;
                  }
                }
                uVar46 = *local_d8;
                lVar43 = local_120;
                if ((int)uVar38 < (int)uVar46) {
                  do {
                    if ((*(byte *)(typelist + lVar43) & 0x80) != 0) {
                      ctx->voccxunknown = ctx->voccxunknown + -1;
                      uVar46 = *local_d8;
                    }
                    lVar43 = lVar43 + 1;
                  } while (lVar43 < (int)uVar46);
                }
                iVar21 = 3;
                prVar32 = prVar39;
                if (0 < (int)prVar39) {
                  do {
                    if ((puVar9[0x21] & 8) != 0) {
                      ctx->voccxunknown = ctx->voccxunknown + 1;
                    }
                    uVar46 = (int)prVar32 - 1;
                    prVar32 = (runcxdef *)(ulong)uVar46;
                  } while (uVar46 != 0);
                }
              }
            }
          }
          else {
            if (prVar10[-1].runstyp != '\x01') {
              prVar39->runcxsp = prVar1;
              goto LAB_001f28cf;
            }
            prVar39->runcxsp = prVar1;
            if (prVar1->runstyp != '\x01') {
              prVar39->runcxerr->errcxptr->erraac = 0;
              runsign(prVar39,0x3eb);
            }
            iVar21 = *(int *)&prVar10[-1].runsv;
            prVar39 = (runcxdef *)0x0;
          }
          if (iVar21 != 3) {
            if (iVar21 == 2) goto LAB_001f29d9;
LAB_001f384e:
            uVar38 = 0xffffffff;
            goto LAB_001f39e2;
          }
        }
LAB_001f3023:
        ctx->voc_stk_cur = (uchar *)list;
        uVar38 = (uint)prVar39;
        if ((int)uVar38 < 0) goto LAB_001f39e2;
        if (uVar38 == 0) goto LAB_001f39a4;
        uVar38 = 200;
        if (200 < (int)uVar45) {
          uVar38 = uVar45;
        }
        lVar43 = 0;
        uVar46 = uVar45;
        do {
          *(undefined8 *)((long)&nounlist[(int)uVar45].vocolflg + lVar43) =
               *(undefined8 *)(puVar9 + lVar43 + 0x20);
          puVar26 = puVar9 + lVar43;
          uVar22 = *(undefined4 *)puVar26;
          uVar12 = *(undefined4 *)(puVar26 + 4);
          uVar13 = *(undefined4 *)(puVar26 + 8);
          uVar14 = *(undefined4 *)(puVar26 + 0xc);
          uVar33 = *(undefined8 *)(puVar9 + lVar43 + 0x10 + 8);
          puVar5 = (undefined8 *)((long)&nounlist[(int)uVar45].vocollst + lVar43);
          *puVar5 = *(undefined8 *)(puVar9 + lVar43 + 0x10);
          puVar5[1] = uVar33;
          puVar6 = (undefined4 *)((long)&nounlist[(int)uVar45].vocolobj + lVar43);
          *puVar6 = uVar22;
          puVar6[1] = uVar12;
          puVar6[2] = uVar13;
          puVar6[3] = uVar14;
          if ((ulong)(uVar38 - uVar45) * 0x28 == lVar43) {
            pcVar34 = "You\'re referring to too many objects.";
            iVar21 = 0xb;
            goto LAB_001f3847;
          }
          lVar43 = lVar43 + 0x28;
          uVar46 = uVar46 + 1;
        } while (((ulong)prVar39 & 0xffffffff) * 0x28 != lVar43);
        uVar45 = uVar46;
        if ((char)local_58 != '\0') {
LAB_001f39c2:
          nounlist[(int)uVar45].vocolobj = 0xffff;
          nounlist[(int)uVar45].vocolflg = 0;
          uVar38 = uVar45;
LAB_001f39e2:
          ctx->voc_stk_cur = puVar9;
          return uVar38;
        }
        uVar38 = *local_d8;
        uVar35 = (ulong)uVar38;
        if (uVar35 == 0xffffffff) goto LAB_001f39c2;
        if ((cmd[(int)uVar38] == (char *)0x0) || (*cmd[(int)uVar38] != ',')) goto LAB_001f39c2;
        lVar43 = 1;
        do {
          lVar29 = lVar43;
          if (cmd[(int)uVar38 + lVar29] == (char *)0x0) break;
          lVar43 = lVar29 + 1;
        } while (*cmd[(int)uVar38 + lVar29] == ',');
        local_128 = (ulong)((int)lVar29 + uVar38);
        local_c4 = (uint)(local_c4 != 0) * 2;
        list = (uint *)ctx->voc_stk_cur;
        puVar40 = (uint *)ctx->voc_stk_end;
        puVar42 = list + 100;
        uVar33 = 0;
      } while (puVar42 <= puVar40);
    }
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

int vocgobj(voccxdef *ctx, char *cmd[], int typelist[],
            int cur, int *next, int complain, vocoldef *nounlist,
            int multi, int chkact, int *no_match)
{
    int       cnt;
    int       outcnt = 0;
    int       i;
    int       again = FALSE;
    int       lastcur;
    vocoldef *tmplist;
    uchar    *save_sp;

    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, tmplist);

    for ( ;; )
    {
        /* try getting a single object */
        cnt = vocg1o(ctx, cmd, typelist, cur, next, complain,
                     tmplist, chkact, no_match);

        /* if we encountered a syntax error, return failure */
        if (cnt < 0)
        {
            VOC_RETVAL(ctx, save_sp, cnt);
        }

        /* if we got any objects, store them in our output list */
        if (cnt > 0)
        {
            for (i = 0 ; i < cnt ; ++i)
            {
                OSCPYSTRUCT(nounlist[outcnt], tmplist[i]);
                if (++outcnt > VOCMAXAMBIG)
                {
                    vocerr(ctx, VOCERR(11),
                           "You're referring to too many objects.");
                    VOC_RETVAL(ctx, save_sp, -1);
                }
            }
        }

        /* if we didn't find any objects, stop looking */
        if (cnt == 0)
        {
            if (again)
                *next = lastcur;
            break;
        }

        /* 
         *   if the caller only wanted a single object (or is getting an
         *   actor, in which case they implicitly want only a single
         *   object), stop looking for additional noun phrases 
         */
        if (!multi || chkact)
            break;

        /* skip past the previous noun phrase */
        cur = *next;

        /* 
         *   if we're looking at a noun phrase separator ("and" or a
         *   comma), get the next noun phrase; otherwise, we're done 
         */
        if (cur != -1 && cmd[cur] != 0 && vocspec(cmd[cur], VOCW_AND))
        {
            lastcur = cur;
            while (cmd[cur] && vocspec(cmd[cur], VOCW_AND)) ++cur;
            again = TRUE;
            if (complain) complain = 2;
        }
        else
        {
            /* end of line, or not at a separator - we're done */
            break;
        }
    }

    /* terminate the list and return the number of objects we found */
    nounlist[outcnt].vocolobj = MCMONINV;
    nounlist[outcnt].vocolflg = 0;
    VOC_RETVAL(ctx, save_sp, outcnt);
}